

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_l1_ur.c
# Opt level: O0

int picnic_l1_ur_write_private_key(picnic_l1_ur_privatekey_t *key,uint8_t *buf,size_t buflen)

{
  ulong in_RDX;
  undefined1 *in_RSI;
  void *in_RDI;
  int local_4;
  
  if ((in_RDI == (void *)0x0) || (in_RSI == (undefined1 *)0x0)) {
    local_4 = -1;
  }
  else if (in_RDX < 0x31) {
    local_4 = -1;
  }
  else {
    *in_RSI = 2;
    memcpy(in_RSI + 1,in_RDI,0x30);
    local_4 = 0x31;
  }
  return local_4;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic_l1_ur_write_private_key(const picnic_l1_ur_privatekey_t* key,
                                                             uint8_t* buf, size_t buflen) {
  if (!key || !buf) {
    return -1;
  }

  if (buflen < PRIVATE_KEY_SIZE) {
    return -1;
  }

  buf[0] = PARAM;
  memcpy(buf + 1, &key->data, PRIVATE_KEY_SIZE - 1);
  return PRIVATE_KEY_SIZE;
}